

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraKateGenerator::CreateKateProjectFile(cmExtraKateGenerator *this,cmLocalGenerator *lg)

{
  string *psVar1;
  ostream *poVar2;
  string filename;
  cmGeneratedFileStream fout;
  string local_2c0;
  string local_2a0;
  undefined1 local_280 [616];
  
  psVar1 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(lg);
  cmStrCat<std::__cxx11::string_const&,char_const(&)[14]>
            (&local_2a0,psVar1,(char (*) [14])"/.kateproject");
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_280,&local_2a0,false,None);
  if (((byte)(*(_func_int **)(local_280._0_8_ + -0x18))[(long)(local_280 + 0x20)] & 5) == 0) {
    poVar2 = std::operator<<((ostream *)local_280,"{\n\t\"name\": \"");
    poVar2 = std::operator<<(poVar2,(string *)&this->ProjectName);
    poVar2 = std::operator<<(poVar2,"\",\n\t\"directory\": \"");
    psVar1 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_(lg);
    poVar2 = std::operator<<(poVar2,(string *)psVar1);
    poVar2 = std::operator<<(poVar2,"\",\n\t\"files\": [ { ");
    GenerateFilesString_abi_cxx11_(&local_2c0,this,lg);
    poVar2 = std::operator<<(poVar2,(string *)&local_2c0);
    std::operator<<(poVar2,"} ],\n");
    std::__cxx11::string::~string((string *)&local_2c0);
    WriteTargets(this,lg,(cmGeneratedFileStream *)local_280);
    std::operator<<((ostream *)local_280,"}\n");
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  return;
}

Assistant:

void cmExtraKateGenerator::CreateKateProjectFile(
  const cmLocalGenerator& lg) const
{
  std::string filename = cmStrCat(lg.GetBinaryDirectory(), "/.kateproject");
  cmGeneratedFileStream fout(filename);
  if (!fout) {
    return;
  }

  /* clang-format off */
  fout <<
    "{\n"
    "\t\"name\": \"" << this->ProjectName << "\",\n"
    "\t\"directory\": \"" << lg.GetSourceDirectory() << "\",\n"
    "\t\"files\": [ { " << this->GenerateFilesString(lg) << "} ],\n";
  /* clang-format on */
  this->WriteTargets(lg, fout);
  fout << "}\n";
}